

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.c
# Opt level: O2

void pnga_scan_copy(Integer g_src,Integer g_dst,Integer g_msk,Integer lo,Integer hi)

{
  long *plVar1;
  int *piVar2;
  float fVar3;
  double dVar4;
  void *pvVar5;
  void *pvVar6;
  Integer IVar7;
  Integer IVar8;
  Integer g_a;
  Integer IVar9;
  logical lVar10;
  void *pvVar11;
  double *pdVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  undefined4 uVar16;
  int iVar17;
  undefined4 uVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  Integer rmt_idx;
  int last_val;
  uint uStack_c4;
  undefined8 uStack_c0;
  void *ptr_msk;
  void *local_a8;
  Integer local_a0;
  Integer local_98;
  Integer local_90;
  void *ptr_dst;
  void *ptr_src;
  Integer ld;
  Integer lop;
  Integer hip;
  Integer local_60;
  Integer type_msk;
  Integer type_src;
  Integer type_dst;
  Integer dims;
  Integer ndim;
  
  ptr_src = (void *)0x0;
  ptr_dst = (void *)0x0;
  ptr_msk = (void *)0x0;
  local_98 = hi;
  IVar9 = pnga_nnodes();
  local_a8 = (void *)pnga_nodeid();
  pnga_check_handle(g_src,"ga_scan_copy 1");
  pnga_check_handle(g_dst,"ga_scan_copy 2");
  pnga_check_handle(g_msk,"ga_scan_copy 3");
  local_a0 = g_src;
  lVar10 = pnga_compare_distr(g_src,g_msk);
  if (lVar10 == 0) {
    pnga_error("ga_scan_copy: different distribution src",0);
  }
  lVar10 = pnga_compare_distr(g_dst,g_msk);
  if (lVar10 == 0) {
    pnga_error("ga_scan_copy: different distribution dst",0);
  }
  pnga_inquire(local_a0,&type_src,&ndim,&dims);
  pnga_inquire(g_dst,&type_dst,&ndim,&dims);
  local_60 = g_msk;
  pnga_inquire(g_msk,&type_msk,&ndim,&dims);
  if (1 < ndim) {
    pnga_error("ga_scan_copy: applicable to 1-dim arrays",ndim);
  }
  if (local_a0 == g_dst) {
    pnga_error("ga_scan_copy: src and dst must be different arrays",0);
  }
  g_a = local_60;
  local_90 = g_dst;
  if (type_src != type_dst) {
    pnga_error("ga_scan_copy: src and dst arrays must be same type",0);
  }
  pnga_sync();
  pvVar5 = local_a8;
  pnga_distribution(g_a,(Integer)local_a8,&lop,&hip);
  pvVar11 = pnga_malloc(IVar9,0x3ea,"ga scan buf");
  memset(pvVar11,0,IVar9 * 8);
  IVar8 = hip;
  IVar7 = lop;
  *(undefined8 *)((long)pvVar11 + (long)pvVar5 * 8) = 0xffffffffffffffff;
  if (0 < lop) {
    pnga_access_ptr(g_a,&lop,&hip,&ptr_msk,&ld);
    if (type_msk - 0x3e9U < 0x10) {
      lVar15 = IVar8 - IVar7;
      switch(type_msk) {
      case 0x3e9:
        for (lVar13 = 0; lVar13 <= lVar15; lVar13 = lVar13 + 1) {
          if ((*(int *)((long)ptr_msk + lVar13 * 4) != 0) &&
             (lVar14 = lop + lVar13, lVar14 <= local_98 && lo <= lVar14)) {
            *(long *)((long)pvVar11 + (long)local_a8 * 8) = lVar14;
          }
        }
        break;
      case 0x3ea:
        for (lVar13 = 0; lVar13 <= lVar15; lVar13 = lVar13 + 1) {
          if ((*(long *)((long)ptr_msk + lVar13 * 8) != 0) &&
             (lVar14 = lop + lVar13, lVar14 <= local_98 && lo <= lVar14)) {
            *(long *)((long)pvVar11 + (long)local_a8 * 8) = lVar14;
          }
        }
        break;
      case 0x3eb:
        for (lVar13 = 0; lVar13 <= lVar15; lVar13 = lVar13 + 1) {
          fVar3 = *(float *)((long)ptr_msk + lVar13 * 4);
          if (((fVar3 != 0.0) || (NAN(fVar3))) &&
             (lVar14 = lop + lVar13, lVar14 <= local_98 && lo <= lVar14)) {
            *(long *)((long)pvVar11 + (long)local_a8 * 8) = lVar14;
          }
        }
        break;
      case 0x3ec:
        for (lVar13 = 0; lVar13 <= lVar15; lVar13 = lVar13 + 1) {
          dVar4 = *(double *)((long)ptr_msk + lVar13 * 8);
          if (((dVar4 != 0.0) || (NAN(dVar4))) &&
             (lVar14 = lop + lVar13, lVar14 <= local_98 && lo <= lVar14)) {
            *(long *)((long)pvVar11 + (long)local_a8 * 8) = lVar14;
          }
        }
        break;
      case 0x3ee:
        for (lVar13 = 0; lVar13 <= lVar15; lVar13 = lVar13 + 1) {
          fVar3 = *(float *)((long)ptr_msk + lVar13 * 8);
          if ((((fVar3 != 0.0) || (NAN(fVar3))) ||
              ((fVar3 = *(float *)((long)ptr_msk + lVar13 * 8 + 4), fVar3 != 0.0 || (NAN(fVar3)))))
             && (lVar14 = lop + lVar13, lVar14 <= local_98 && lo <= lVar14)) {
            *(long *)((long)pvVar11 + (long)local_a8 * 8) = lVar14;
          }
        }
        break;
      case 0x3ef:
        pdVar12 = (double *)((long)ptr_msk + 8);
        for (lVar13 = 0; lVar13 <= lVar15; lVar13 = lVar13 + 1) {
          if (((((pdVar12[-1] != 0.0) || (NAN(pdVar12[-1]))) || (*pdVar12 != 0.0)) ||
              (NAN(*pdVar12))) && (lVar14 = lop + lVar13, lVar14 <= local_98 && lo <= lVar14)) {
            *(long *)((long)pvVar11 + (long)local_a8 * 8) = lVar14;
          }
          pdVar12 = pdVar12 + 2;
        }
        break;
      case 0x3f8:
        for (lVar13 = 0; lVar13 <= lVar15; lVar13 = lVar13 + 1) {
          if ((*(long *)((long)ptr_msk + lVar13 * 8) != 0) &&
             (lVar14 = lop + lVar13, lVar14 <= local_98 && lo <= lVar14)) {
            *(long *)((long)pvVar11 + (long)local_a8 * 8) = lVar14;
          }
        }
      }
    }
    pnga_release(g_a,&lop,&hip);
  }
  pnga_gop(0x3ea,pvVar11,IVar9,"+");
  if (hip < lo || local_98 < lop) goto LAB_0012f2b6;
  if (hip < local_98) {
    local_98 = hip;
  }
  rmt_idx = -1;
  lVar15 = 0;
  if (IVar9 < 1) {
    IVar9 = lVar15;
  }
  lVar13 = -1;
  for (; IVar9 != lVar15; lVar15 = lVar15 + 1) {
    lVar14 = *(long *)((long)pvVar11 + lVar15 * 8);
    if (((lVar14 < lop) && (lVar14 != -1)) && (lVar13 < lVar14)) {
      lVar13 = lVar14;
      rmt_idx = lVar14;
    }
  }
  lVar15 = 0;
  if (lop < lo) {
    lVar15 = lo - lop;
  }
  local_98 = local_98 - lop;
  local_a8 = pvVar11;
  pnga_access_ptr(local_a0,&lop,&hip,&ptr_src,&ld);
  pnga_access_ptr(local_90,&lop,&hip,&ptr_dst,&ld);
  pnga_access_ptr(local_60,&lop,&hip,&ptr_msk,&ld);
  pvVar6 = ptr_src;
  pvVar11 = ptr_dst;
  pvVar5 = ptr_msk;
  lVar13 = type_src * 0x11 + type_msk;
  switch(type_src * 0x11 + type_msk) {
  case 0x4662:
    _last_val = (ulong)uStack_c4 << 0x20;
    if (rmt_idx != -1) {
      pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
    }
    for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
      if (*(int *)((long)pvVar5 + lVar15 * 4) == 0) {
        iVar17 = last_val;
      }
      else {
        iVar17 = *(int *)((long)pvVar6 + lVar15 * 4);
        _last_val = CONCAT44(uStack_c4,iVar17);
      }
      *(int *)((long)pvVar11 + lVar15 * 4) = iVar17;
    }
    break;
  case 0x4663:
    _last_val = (ulong)uStack_c4 << 0x20;
    if (rmt_idx != -1) {
      pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
    }
    for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
      if (*(long *)((long)pvVar5 + lVar15 * 8) == 0) {
        iVar17 = last_val;
      }
      else {
        iVar17 = *(int *)((long)pvVar6 + lVar15 * 4);
        _last_val = CONCAT44(uStack_c4,iVar17);
      }
      *(int *)((long)pvVar11 + lVar15 * 4) = iVar17;
    }
    break;
  case 0x4664:
    _last_val = (ulong)uStack_c4 << 0x20;
    if (rmt_idx != -1) {
      pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
    }
    for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
      fVar3 = *(float *)((long)pvVar5 + lVar15 * 4);
      if ((fVar3 != 0.0) || (NAN(fVar3))) {
        iVar17 = *(int *)((long)pvVar6 + lVar15 * 4);
        _last_val = CONCAT44(uStack_c4,iVar17);
      }
      else {
        iVar17 = last_val;
      }
      *(int *)((long)pvVar11 + lVar15 * 4) = iVar17;
    }
    break;
  case 0x4665:
    _last_val = (ulong)uStack_c4 << 0x20;
    if (rmt_idx != -1) {
      pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
    }
    for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
      dVar4 = *(double *)((long)pvVar5 + lVar15 * 8);
      if ((dVar4 != 0.0) || (NAN(dVar4))) {
        iVar17 = *(int *)((long)pvVar6 + lVar15 * 4);
        _last_val = CONCAT44(uStack_c4,iVar17);
      }
      else {
        iVar17 = last_val;
      }
      *(int *)((long)pvVar11 + lVar15 * 4) = iVar17;
    }
    break;
  case 0x4666:
  case 0x4669:
  case 0x466a:
  case 0x466b:
  case 0x466c:
  case 0x466d:
  case 0x466e:
  case 0x466f:
  case 0x4670:
  case 0x4672:
  case 0x4677:
  case 0x467a:
  case 0x467b:
  case 0x467c:
  case 0x467d:
  case 0x467e:
  case 0x467f:
  case 0x4680:
  case 0x4681:
  case 0x4683:
  case 0x4688:
  case 0x468b:
  case 0x468c:
  case 0x468d:
  case 0x468e:
  case 0x468f:
  case 0x4690:
  case 0x4691:
  case 0x4692:
  case 0x4694:
  case 0x4699:
  case 0x469c:
  case 0x469d:
  case 0x469e:
  case 0x469f:
  case 0x46a0:
  case 0x46a1:
  case 0x46a2:
  case 0x46a3:
switchD_0012dc84_caseD_4666:
    pnga_error("ga_scan_copy:wrong data type",lVar13);
    break;
  case 0x4667:
    _last_val = (ulong)uStack_c4 << 0x20;
    if (rmt_idx != -1) {
      pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
    }
    for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
      fVar3 = *(float *)((long)pvVar5 + lVar15 * 8);
      if (((fVar3 != 0.0) || (NAN(fVar3))) ||
         ((fVar3 = *(float *)((long)pvVar5 + lVar15 * 8 + 4), fVar3 != 0.0 || (NAN(fVar3))))) {
        iVar17 = *(int *)((long)pvVar6 + lVar15 * 4);
        _last_val = CONCAT44(uStack_c4,iVar17);
      }
      else {
        iVar17 = last_val;
      }
      *(int *)((long)pvVar11 + lVar15 * 4) = iVar17;
    }
    break;
  case 0x4668:
    _last_val = (ulong)uStack_c4 << 0x20;
    if (rmt_idx != -1) {
      pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
    }
    if (lo < lop) {
      lo = lop;
    }
    pdVar12 = (double *)((long)pvVar5 + lo * 0x10 + lop * -0x10 + 8);
    for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
      if ((((pdVar12[-1] != 0.0) || (NAN(pdVar12[-1]))) || (*pdVar12 != 0.0)) || (NAN(*pdVar12))) {
        iVar17 = *(int *)((long)pvVar6 + lVar15 * 4);
        _last_val = CONCAT44(uStack_c4,iVar17);
      }
      else {
        iVar17 = last_val;
      }
      *(int *)((long)pvVar11 + lVar15 * 4) = iVar17;
      pdVar12 = pdVar12 + 2;
    }
    break;
  case 0x4671:
    _last_val = (ulong)uStack_c4 << 0x20;
    if (rmt_idx != -1) {
      pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
    }
    for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
      if (*(long *)((long)pvVar5 + lVar15 * 8) == 0) {
        iVar17 = last_val;
      }
      else {
        iVar17 = *(int *)((long)pvVar6 + lVar15 * 4);
        _last_val = CONCAT44(uStack_c4,iVar17);
      }
      *(int *)((long)pvVar11 + lVar15 * 4) = iVar17;
    }
    break;
  case 0x4673:
    _last_val = 0;
    if (rmt_idx != -1) {
      pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
    }
    for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
      if (*(int *)((long)pvVar5 + lVar15 * 4) != 0) {
        _last_val = *(long *)((long)pvVar6 + lVar15 * 8);
      }
      *(long *)((long)pvVar11 + lVar15 * 8) = _last_val;
    }
    break;
  case 0x4674:
    _last_val = 0;
    if (rmt_idx != -1) {
      pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
    }
    for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
      if (*(long *)((long)pvVar5 + lVar15 * 8) != 0) {
        _last_val = *(long *)((long)pvVar6 + lVar15 * 8);
      }
      *(long *)((long)pvVar11 + lVar15 * 8) = _last_val;
    }
    break;
  case 0x4675:
    _last_val = 0;
    if (rmt_idx != -1) {
      pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
    }
    for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
      fVar3 = *(float *)((long)pvVar5 + lVar15 * 4);
      if ((fVar3 != 0.0) || (NAN(fVar3))) {
        _last_val = *(long *)((long)pvVar6 + lVar15 * 8);
      }
      *(long *)((long)pvVar11 + lVar15 * 8) = _last_val;
    }
    break;
  case 0x4676:
    _last_val = 0;
    if (rmt_idx != -1) {
      pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
    }
    for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
      dVar4 = *(double *)((long)pvVar5 + lVar15 * 8);
      if ((dVar4 != 0.0) || (NAN(dVar4))) {
        _last_val = *(long *)((long)pvVar6 + lVar15 * 8);
      }
      *(long *)((long)pvVar11 + lVar15 * 8) = _last_val;
    }
    break;
  case 0x4678:
    _last_val = 0;
    if (rmt_idx != -1) {
      pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
    }
    for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
      fVar3 = *(float *)((long)pvVar5 + lVar15 * 8);
      if (((fVar3 != 0.0) || (NAN(fVar3))) ||
         ((fVar3 = *(float *)((long)pvVar5 + lVar15 * 8 + 4), fVar3 != 0.0 || (NAN(fVar3))))) {
        _last_val = *(long *)((long)pvVar6 + lVar15 * 8);
      }
      *(long *)((long)pvVar11 + lVar15 * 8) = _last_val;
    }
    break;
  case 0x4679:
    _last_val = 0;
    if (rmt_idx != -1) {
      pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
    }
    if (lo < lop) {
      lo = lop;
    }
    pdVar12 = (double *)((long)pvVar5 + lo * 0x10 + lop * -0x10 + 8);
    for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
      if ((((pdVar12[-1] != 0.0) || (NAN(pdVar12[-1]))) || (*pdVar12 != 0.0)) || (NAN(*pdVar12))) {
        _last_val = *(long *)((long)pvVar6 + lVar15 * 8);
      }
      *(long *)((long)pvVar11 + lVar15 * 8) = _last_val;
      pdVar12 = pdVar12 + 2;
    }
    break;
  case 0x4682:
    _last_val = 0;
    if (rmt_idx != -1) {
      pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
    }
    for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
      if (*(long *)((long)pvVar5 + lVar15 * 8) != 0) {
        _last_val = *(long *)((long)pvVar6 + lVar15 * 8);
      }
      *(long *)((long)pvVar11 + lVar15 * 8) = _last_val;
    }
    break;
  case 0x4684:
    _last_val = (ulong)uStack_c4 << 0x20;
    if (rmt_idx != -1) {
      pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
    }
    for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
      if (*(int *)((long)pvVar5 + lVar15 * 4) == 0) {
        iVar17 = last_val;
      }
      else {
        iVar17 = *(int *)((long)pvVar6 + lVar15 * 4);
        _last_val = CONCAT44(uStack_c4,iVar17);
      }
      *(int *)((long)pvVar11 + lVar15 * 4) = iVar17;
    }
    break;
  case 0x4685:
    _last_val = (ulong)uStack_c4 << 0x20;
    if (rmt_idx != -1) {
      pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
    }
    for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
      if (*(long *)((long)pvVar5 + lVar15 * 8) == 0) {
        iVar17 = last_val;
      }
      else {
        iVar17 = *(int *)((long)pvVar6 + lVar15 * 4);
        _last_val = CONCAT44(uStack_c4,iVar17);
      }
      *(int *)((long)pvVar11 + lVar15 * 4) = iVar17;
    }
    break;
  case 0x4686:
    _last_val = (ulong)uStack_c4 << 0x20;
    if (rmt_idx != -1) {
      pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
    }
    for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
      fVar3 = *(float *)((long)pvVar5 + lVar15 * 4);
      if ((fVar3 != 0.0) || (NAN(fVar3))) {
        iVar17 = *(int *)((long)pvVar6 + lVar15 * 4);
        _last_val = CONCAT44(uStack_c4,iVar17);
      }
      else {
        iVar17 = last_val;
      }
      *(int *)((long)pvVar11 + lVar15 * 4) = iVar17;
    }
    break;
  case 0x4687:
    _last_val = (ulong)uStack_c4 << 0x20;
    if (rmt_idx != -1) {
      pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
    }
    for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
      dVar4 = *(double *)((long)pvVar5 + lVar15 * 8);
      if ((dVar4 != 0.0) || (NAN(dVar4))) {
        iVar17 = *(int *)((long)pvVar6 + lVar15 * 4);
        _last_val = CONCAT44(uStack_c4,iVar17);
      }
      else {
        iVar17 = last_val;
      }
      *(int *)((long)pvVar11 + lVar15 * 4) = iVar17;
    }
    break;
  case 0x4689:
    _last_val = (ulong)uStack_c4 << 0x20;
    if (rmt_idx != -1) {
      pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
    }
    for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
      fVar3 = *(float *)((long)pvVar5 + lVar15 * 8);
      if (((fVar3 != 0.0) || (NAN(fVar3))) ||
         ((fVar3 = *(float *)((long)pvVar5 + lVar15 * 8 + 4), fVar3 != 0.0 || (NAN(fVar3))))) {
        iVar17 = *(int *)((long)pvVar6 + lVar15 * 4);
        _last_val = CONCAT44(uStack_c4,iVar17);
      }
      else {
        iVar17 = last_val;
      }
      *(int *)((long)pvVar11 + lVar15 * 4) = iVar17;
    }
    break;
  case 0x468a:
    _last_val = (ulong)uStack_c4 << 0x20;
    if (rmt_idx != -1) {
      pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
    }
    if (lo < lop) {
      lo = lop;
    }
    pdVar12 = (double *)((long)pvVar5 + lo * 0x10 + lop * -0x10 + 8);
    for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
      if ((((pdVar12[-1] != 0.0) || (NAN(pdVar12[-1]))) || (*pdVar12 != 0.0)) || (NAN(*pdVar12))) {
        iVar17 = *(int *)((long)pvVar6 + lVar15 * 4);
        _last_val = CONCAT44(uStack_c4,iVar17);
      }
      else {
        iVar17 = last_val;
      }
      *(int *)((long)pvVar11 + lVar15 * 4) = iVar17;
      pdVar12 = pdVar12 + 2;
    }
    break;
  case 0x4693:
    _last_val = (ulong)uStack_c4 << 0x20;
    if (rmt_idx != -1) {
      pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
    }
    for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
      if (*(long *)((long)pvVar5 + lVar15 * 8) == 0) {
        iVar17 = last_val;
      }
      else {
        iVar17 = *(int *)((long)pvVar6 + lVar15 * 4);
        _last_val = CONCAT44(uStack_c4,iVar17);
      }
      *(int *)((long)pvVar11 + lVar15 * 4) = iVar17;
    }
    break;
  case 0x4695:
    _last_val = 0;
    if (rmt_idx != -1) {
      pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
    }
    for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
      if (*(int *)((long)pvVar5 + lVar15 * 4) == 0) {
        uVar16 = (undefined4)_last_val;
        uVar18 = (undefined4)((ulong)_last_val >> 0x20);
      }
      else {
        _last_val = *(long *)((long)pvVar6 + lVar15 * 8);
        uVar16 = (undefined4)_last_val;
        uVar18 = (undefined4)((ulong)_last_val >> 0x20);
      }
      *(ulong *)((long)pvVar11 + lVar15 * 8) = CONCAT44(uVar18,uVar16);
    }
    break;
  case 0x4696:
    _last_val = 0;
    if (rmt_idx != -1) {
      pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
    }
    for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
      if (*(long *)((long)pvVar5 + lVar15 * 8) == 0) {
        uVar16 = (undefined4)_last_val;
        uVar18 = (undefined4)((ulong)_last_val >> 0x20);
      }
      else {
        _last_val = *(long *)((long)pvVar6 + lVar15 * 8);
        uVar16 = (undefined4)_last_val;
        uVar18 = (undefined4)((ulong)_last_val >> 0x20);
      }
      *(ulong *)((long)pvVar11 + lVar15 * 8) = CONCAT44(uVar18,uVar16);
    }
    break;
  case 0x4697:
    _last_val = 0;
    if (rmt_idx != -1) {
      pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
    }
    for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
      fVar3 = *(float *)((long)pvVar5 + lVar15 * 4);
      if ((fVar3 != 0.0) || (NAN(fVar3))) {
        _last_val = *(long *)((long)pvVar6 + lVar15 * 8);
        uVar16 = (undefined4)_last_val;
        uVar18 = (undefined4)((ulong)_last_val >> 0x20);
      }
      else {
        uVar16 = (undefined4)_last_val;
        uVar18 = (undefined4)((ulong)_last_val >> 0x20);
      }
      *(ulong *)((long)pvVar11 + lVar15 * 8) = CONCAT44(uVar18,uVar16);
    }
    break;
  case 0x4698:
    _last_val = 0;
    if (rmt_idx != -1) {
      pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
    }
    for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
      dVar4 = *(double *)((long)pvVar5 + lVar15 * 8);
      if ((dVar4 != 0.0) || (NAN(dVar4))) {
        _last_val = *(long *)((long)pvVar6 + lVar15 * 8);
        uVar16 = (undefined4)_last_val;
        uVar18 = (undefined4)((ulong)_last_val >> 0x20);
      }
      else {
        uVar16 = (undefined4)_last_val;
        uVar18 = (undefined4)((ulong)_last_val >> 0x20);
      }
      *(ulong *)((long)pvVar11 + lVar15 * 8) = CONCAT44(uVar18,uVar16);
    }
    break;
  case 0x469a:
    _last_val = 0;
    if (rmt_idx != -1) {
      pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
    }
    for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
      fVar3 = *(float *)((long)pvVar5 + lVar15 * 8);
      if (((fVar3 != 0.0) || (NAN(fVar3))) ||
         ((fVar3 = *(float *)((long)pvVar5 + lVar15 * 8 + 4), fVar3 != 0.0 || (NAN(fVar3))))) {
        _last_val = *(long *)((long)pvVar6 + lVar15 * 8);
        uVar16 = (undefined4)_last_val;
        uVar18 = (undefined4)((ulong)_last_val >> 0x20);
      }
      else {
        uVar16 = (undefined4)_last_val;
        uVar18 = (undefined4)((ulong)_last_val >> 0x20);
      }
      *(ulong *)((long)pvVar11 + lVar15 * 8) = CONCAT44(uVar18,uVar16);
    }
    break;
  case 0x469b:
    _last_val = 0;
    if (rmt_idx != -1) {
      pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
    }
    if (lo < lop) {
      lo = lop;
    }
    pdVar12 = (double *)((long)pvVar5 + lo * 0x10 + lop * -0x10 + 8);
    for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
      if ((((pdVar12[-1] != 0.0) || (NAN(pdVar12[-1]))) || (*pdVar12 != 0.0)) || (NAN(*pdVar12))) {
        _last_val = *(long *)((long)pvVar6 + lVar15 * 8);
        uVar16 = (undefined4)_last_val;
        uVar18 = (undefined4)((ulong)_last_val >> 0x20);
      }
      else {
        uVar16 = (undefined4)_last_val;
        uVar18 = (undefined4)((ulong)_last_val >> 0x20);
      }
      *(ulong *)((long)pvVar11 + lVar15 * 8) = CONCAT44(uVar18,uVar16);
      pdVar12 = pdVar12 + 2;
    }
    break;
  case 0x46a4:
    _last_val = 0;
    if (rmt_idx != -1) {
      pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
    }
    for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
      if (*(long *)((long)pvVar5 + lVar15 * 8) == 0) {
        uVar16 = (undefined4)_last_val;
        uVar18 = (undefined4)((ulong)_last_val >> 0x20);
      }
      else {
        _last_val = *(long *)((long)pvVar6 + lVar15 * 8);
        uVar16 = (undefined4)_last_val;
        uVar18 = (undefined4)((ulong)_last_val >> 0x20);
      }
      *(ulong *)((long)pvVar11 + lVar15 * 8) = CONCAT44(uVar18,uVar16);
    }
    break;
  default:
    switch(lVar13) {
    case 0x46b7:
      _last_val = 0;
      if (rmt_idx != -1) {
        pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
      }
      for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
        if (*(int *)((long)pvVar5 + lVar15 * 4) == 0) {
          uVar16 = (undefined4)_last_val;
          uVar18 = (undefined4)((ulong)_last_val >> 0x20);
        }
        else {
          _last_val = *(long *)((long)pvVar6 + lVar15 * 8);
          uVar16 = (undefined4)_last_val;
          uVar18 = (undefined4)((ulong)_last_val >> 0x20);
        }
        *(ulong *)((long)pvVar11 + lVar15 * 8) = CONCAT44(uVar18,uVar16);
      }
      break;
    case 0x46b8:
      _last_val = 0;
      if (rmt_idx != -1) {
        pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
      }
      for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
        if (*(long *)((long)pvVar5 + lVar15 * 8) == 0) {
          uVar16 = (undefined4)_last_val;
          uVar18 = (undefined4)((ulong)_last_val >> 0x20);
        }
        else {
          _last_val = *(long *)((long)pvVar6 + lVar15 * 8);
          uVar16 = (undefined4)_last_val;
          uVar18 = (undefined4)((ulong)_last_val >> 0x20);
        }
        *(ulong *)((long)pvVar11 + lVar15 * 8) = CONCAT44(uVar18,uVar16);
      }
      break;
    case 0x46b9:
      _last_val = 0;
      if (rmt_idx != -1) {
        pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
      }
      for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
        fVar3 = *(float *)((long)pvVar5 + lVar15 * 4);
        if ((fVar3 != 0.0) || (NAN(fVar3))) {
          _last_val = *(long *)((long)pvVar6 + lVar15 * 8);
          uVar16 = (undefined4)_last_val;
          uVar18 = (undefined4)((ulong)_last_val >> 0x20);
        }
        else {
          uVar16 = (undefined4)_last_val;
          uVar18 = (undefined4)((ulong)_last_val >> 0x20);
        }
        *(ulong *)((long)pvVar11 + lVar15 * 8) = CONCAT44(uVar18,uVar16);
      }
      break;
    case 0x46ba:
      _last_val = 0;
      if (rmt_idx != -1) {
        pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
      }
      for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
        dVar4 = *(double *)((long)pvVar5 + lVar15 * 8);
        if ((dVar4 != 0.0) || (NAN(dVar4))) {
          _last_val = *(long *)((long)pvVar6 + lVar15 * 8);
          uVar16 = (undefined4)_last_val;
          uVar18 = (undefined4)((ulong)_last_val >> 0x20);
        }
        else {
          uVar16 = (undefined4)_last_val;
          uVar18 = (undefined4)((ulong)_last_val >> 0x20);
        }
        *(ulong *)((long)pvVar11 + lVar15 * 8) = CONCAT44(uVar18,uVar16);
      }
      break;
    case 0x46bb:
    case 0x46be:
    case 0x46bf:
    case 0x46c0:
    case 0x46c1:
    case 0x46c2:
    case 0x46c3:
    case 0x46c4:
    case 0x46c5:
    case 0x46c7:
    case 0x46cc:
    case 0x46cf:
    case 0x46d0:
    case 0x46d1:
    case 0x46d2:
    case 0x46d3:
    case 0x46d4:
    case 0x46d5:
    case 0x46d6:
      goto switchD_0012dc84_caseD_4666;
    case 0x46bc:
      _last_val = 0;
      if (rmt_idx != -1) {
        pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
      }
      for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
        fVar3 = *(float *)((long)pvVar5 + lVar15 * 8);
        if (((fVar3 != 0.0) || (NAN(fVar3))) ||
           ((fVar3 = *(float *)((long)pvVar5 + lVar15 * 8 + 4), fVar3 != 0.0 || (NAN(fVar3))))) {
          _last_val = *(long *)((long)pvVar6 + lVar15 * 8);
          uVar16 = (undefined4)_last_val;
          uVar18 = (undefined4)((ulong)_last_val >> 0x20);
        }
        else {
          uVar16 = (undefined4)_last_val;
          uVar18 = (undefined4)((ulong)_last_val >> 0x20);
        }
        *(ulong *)((long)pvVar11 + lVar15 * 8) = CONCAT44(uVar18,uVar16);
      }
      break;
    case 0x46bd:
      _last_val = 0;
      if (rmt_idx != -1) {
        pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
      }
      if (lo < lop) {
        lo = lop;
      }
      pdVar12 = (double *)((long)pvVar5 + lo * 0x10 + lop * -0x10 + 8);
      for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
        if ((((pdVar12[-1] != 0.0) || (NAN(pdVar12[-1]))) || (*pdVar12 != 0.0)) || (NAN(*pdVar12)))
        {
          _last_val = *(long *)((long)pvVar6 + lVar15 * 8);
          uVar16 = (undefined4)_last_val;
          uVar18 = (undefined4)((ulong)_last_val >> 0x20);
        }
        else {
          uVar16 = (undefined4)_last_val;
          uVar18 = (undefined4)((ulong)_last_val >> 0x20);
        }
        *(ulong *)((long)pvVar11 + lVar15 * 8) = CONCAT44(uVar18,uVar16);
        pdVar12 = pdVar12 + 2;
      }
      break;
    case 0x46c6:
      _last_val = 0;
      if (rmt_idx != -1) {
        pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
      }
      for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
        if (*(long *)((long)pvVar5 + lVar15 * 8) == 0) {
          uVar16 = (undefined4)_last_val;
          uVar18 = (undefined4)((ulong)_last_val >> 0x20);
        }
        else {
          _last_val = *(long *)((long)pvVar6 + lVar15 * 8);
          uVar16 = (undefined4)_last_val;
          uVar18 = (undefined4)((ulong)_last_val >> 0x20);
        }
        *(ulong *)((long)pvVar11 + lVar15 * 8) = CONCAT44(uVar18,uVar16);
      }
      break;
    case 0x46c8:
      _last_val = 0;
      uStack_c0 = 0;
      if (rmt_idx != -1) {
        pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
      }
      if (lo < lop) {
        lo = lop;
      }
      lVar13 = lo * 0x10 + lop * -0x10;
      for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
        if (*(int *)((long)pvVar5 + lVar15 * 4) == 0) {
          iVar17 = last_val;
          uVar19 = uStack_c4;
          iVar20 = (int)uStack_c0;
          iVar21 = uStack_c0._4_4_;
        }
        else {
          plVar1 = (long *)((long)pvVar6 + lVar13);
          _last_val = *plVar1;
          uStack_c0 = plVar1[1];
          iVar17 = (int)*plVar1;
          uVar19 = *(int *)((long)plVar1 + 4);
          iVar20 = (int)plVar1[1];
          iVar21 = *(int *)((long)plVar1 + 0xc);
        }
        piVar2 = (int *)((long)pvVar11 + lVar13);
        *piVar2 = iVar17;
        piVar2[1] = uVar19;
        piVar2[2] = iVar20;
        piVar2[3] = iVar21;
        lVar13 = lVar13 + 0x10;
      }
      break;
    case 0x46c9:
      _last_val = 0;
      uStack_c0 = 0;
      if (rmt_idx != -1) {
        pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
      }
      if (lo < lop) {
        lo = lop;
      }
      lVar13 = lo * 0x10 + lop * -0x10;
      for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
        if (*(long *)((long)pvVar5 + lVar15 * 8) == 0) {
          iVar17 = last_val;
          uVar19 = uStack_c4;
          iVar20 = (int)uStack_c0;
          iVar21 = uStack_c0._4_4_;
        }
        else {
          plVar1 = (long *)((long)pvVar6 + lVar13);
          _last_val = *plVar1;
          uStack_c0 = plVar1[1];
          iVar17 = (int)*plVar1;
          uVar19 = *(int *)((long)plVar1 + 4);
          iVar20 = (int)plVar1[1];
          iVar21 = *(int *)((long)plVar1 + 0xc);
        }
        piVar2 = (int *)((long)pvVar11 + lVar13);
        *piVar2 = iVar17;
        piVar2[1] = uVar19;
        piVar2[2] = iVar20;
        piVar2[3] = iVar21;
        lVar13 = lVar13 + 0x10;
      }
      break;
    case 0x46ca:
      _last_val = 0;
      uStack_c0 = 0;
      if (rmt_idx != -1) {
        pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
      }
      if (lo < lop) {
        lo = lop;
      }
      lVar13 = lo * 0x10 + lop * -0x10;
      for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
        fVar3 = *(float *)((long)pvVar5 + lVar15 * 4);
        if ((fVar3 != 0.0) || (NAN(fVar3))) {
          plVar1 = (long *)((long)pvVar6 + lVar13);
          _last_val = *plVar1;
          uStack_c0 = plVar1[1];
          iVar17 = (int)*plVar1;
          uVar19 = *(int *)((long)plVar1 + 4);
          iVar20 = (int)plVar1[1];
          iVar21 = *(int *)((long)plVar1 + 0xc);
        }
        else {
          iVar17 = last_val;
          uVar19 = uStack_c4;
          iVar20 = (int)uStack_c0;
          iVar21 = uStack_c0._4_4_;
        }
        piVar2 = (int *)((long)pvVar11 + lVar13);
        *piVar2 = iVar17;
        piVar2[1] = uVar19;
        piVar2[2] = iVar20;
        piVar2[3] = iVar21;
        lVar13 = lVar13 + 0x10;
      }
      break;
    case 0x46cb:
      _last_val = 0;
      uStack_c0 = 0;
      if (rmt_idx != -1) {
        pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
      }
      if (lo < lop) {
        lo = lop;
      }
      lVar13 = lo * 0x10 + lop * -0x10;
      for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
        dVar4 = *(double *)((long)pvVar5 + lVar15 * 8);
        if ((dVar4 != 0.0) || (NAN(dVar4))) {
          plVar1 = (long *)((long)pvVar6 + lVar13);
          _last_val = *plVar1;
          uStack_c0 = plVar1[1];
          iVar17 = (int)*plVar1;
          uVar19 = *(int *)((long)plVar1 + 4);
          iVar20 = (int)plVar1[1];
          iVar21 = *(int *)((long)plVar1 + 0xc);
        }
        else {
          iVar17 = last_val;
          uVar19 = uStack_c4;
          iVar20 = (int)uStack_c0;
          iVar21 = uStack_c0._4_4_;
        }
        piVar2 = (int *)((long)pvVar11 + lVar13);
        *piVar2 = iVar17;
        piVar2[1] = uVar19;
        piVar2[2] = iVar20;
        piVar2[3] = iVar21;
        lVar13 = lVar13 + 0x10;
      }
      break;
    case 0x46cd:
      _last_val = 0;
      uStack_c0 = 0;
      if (rmt_idx != -1) {
        pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
      }
      if (lo < lop) {
        lo = lop;
      }
      lVar13 = lo * 0x10 + lop * -0x10;
      for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
        fVar3 = *(float *)((long)pvVar5 + lVar15 * 8);
        if (((fVar3 != 0.0) || (NAN(fVar3))) ||
           ((fVar3 = *(float *)((long)pvVar5 + lVar15 * 8 + 4), fVar3 != 0.0 || (NAN(fVar3))))) {
          plVar1 = (long *)((long)pvVar6 + lVar13);
          _last_val = *plVar1;
          uStack_c0 = plVar1[1];
          iVar17 = (int)*plVar1;
          uVar19 = *(int *)((long)plVar1 + 4);
          iVar20 = (int)plVar1[1];
          iVar21 = *(int *)((long)plVar1 + 0xc);
        }
        else {
          iVar17 = last_val;
          uVar19 = uStack_c4;
          iVar20 = (int)uStack_c0;
          iVar21 = uStack_c0._4_4_;
        }
        piVar2 = (int *)((long)pvVar11 + lVar13);
        *piVar2 = iVar17;
        piVar2[1] = uVar19;
        piVar2[2] = iVar20;
        piVar2[3] = iVar21;
        lVar13 = lVar13 + 0x10;
      }
      break;
    case 0x46ce:
      _last_val = 0;
      uStack_c0 = 0;
      if (rmt_idx != -1) {
        pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
      }
      if (lo < lop) {
        lo = lop;
      }
      lVar13 = lo * 0x10 + lop * -0x10;
      for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
        if ((((*(double *)((long)pvVar5 + lVar13) != 0.0) ||
             (NAN(*(double *)((long)pvVar5 + lVar13)))) ||
            (dVar4 = *(double *)((long)pvVar5 + lVar13 + 8), dVar4 != 0.0)) || (NAN(dVar4))) {
          plVar1 = (long *)((long)pvVar6 + lVar13);
          _last_val = *plVar1;
          uStack_c0 = plVar1[1];
          iVar17 = (int)*plVar1;
          uVar19 = *(int *)((long)plVar1 + 4);
          iVar20 = (int)plVar1[1];
          iVar21 = *(int *)((long)plVar1 + 0xc);
        }
        else {
          iVar17 = last_val;
          uVar19 = uStack_c4;
          iVar20 = (int)uStack_c0;
          iVar21 = uStack_c0._4_4_;
        }
        piVar2 = (int *)((long)pvVar11 + lVar13);
        *piVar2 = iVar17;
        piVar2[1] = uVar19;
        piVar2[2] = iVar20;
        piVar2[3] = iVar21;
        lVar13 = lVar13 + 0x10;
      }
      break;
    case 0x46d7:
      _last_val = 0;
      uStack_c0 = 0;
      if (rmt_idx != -1) {
        pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
      }
      if (lo < lop) {
        lo = lop;
      }
      lVar13 = lo * 0x10 + lop * -0x10;
      for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
        if (*(long *)((long)pvVar5 + lVar15 * 8) == 0) {
          iVar17 = last_val;
          uVar19 = uStack_c4;
          iVar20 = (int)uStack_c0;
          iVar21 = uStack_c0._4_4_;
        }
        else {
          plVar1 = (long *)((long)pvVar6 + lVar13);
          _last_val = *plVar1;
          uStack_c0 = plVar1[1];
          iVar17 = (int)*plVar1;
          uVar19 = *(int *)((long)plVar1 + 4);
          iVar20 = (int)plVar1[1];
          iVar21 = *(int *)((long)plVar1 + 0xc);
        }
        piVar2 = (int *)((long)pvVar11 + lVar13);
        *piVar2 = iVar17;
        piVar2[1] = uVar19;
        piVar2[2] = iVar20;
        piVar2[3] = iVar21;
        lVar13 = lVar13 + 0x10;
      }
      break;
    default:
      switch(lVar13) {
      case 0x4761:
        _last_val = 0;
        if (rmt_idx != -1) {
          pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
        }
        for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
          if (*(int *)((long)pvVar5 + lVar15 * 4) != 0) {
            _last_val = *(long *)((long)pvVar6 + lVar15 * 8);
          }
          *(long *)((long)pvVar11 + lVar15 * 8) = _last_val;
        }
        break;
      case 0x4762:
        _last_val = 0;
        if (rmt_idx != -1) {
          pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
        }
        for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
          if (*(long *)((long)pvVar5 + lVar15 * 8) != 0) {
            _last_val = *(long *)((long)pvVar6 + lVar15 * 8);
          }
          *(long *)((long)pvVar11 + lVar15 * 8) = _last_val;
        }
        break;
      case 0x4763:
        _last_val = 0;
        if (rmt_idx != -1) {
          pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
        }
        for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
          fVar3 = *(float *)((long)pvVar5 + lVar15 * 4);
          if ((fVar3 != 0.0) || (NAN(fVar3))) {
            _last_val = *(long *)((long)pvVar6 + lVar15 * 8);
          }
          *(long *)((long)pvVar11 + lVar15 * 8) = _last_val;
        }
        break;
      case 0x4764:
        _last_val = 0;
        if (rmt_idx != -1) {
          pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
        }
        for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
          dVar4 = *(double *)((long)pvVar5 + lVar15 * 8);
          if ((dVar4 != 0.0) || (NAN(dVar4))) {
            _last_val = *(long *)((long)pvVar6 + lVar15 * 8);
          }
          *(long *)((long)pvVar11 + lVar15 * 8) = _last_val;
        }
        break;
      default:
        goto switchD_0012dc84_caseD_4666;
      case 0x4766:
        _last_val = 0;
        if (rmt_idx != -1) {
          pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
        }
        for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
          fVar3 = *(float *)((long)pvVar5 + lVar15 * 8);
          if (((fVar3 != 0.0) || (NAN(fVar3))) ||
             ((fVar3 = *(float *)((long)pvVar5 + lVar15 * 8 + 4), fVar3 != 0.0 || (NAN(fVar3))))) {
            _last_val = *(long *)((long)pvVar6 + lVar15 * 8);
          }
          *(long *)((long)pvVar11 + lVar15 * 8) = _last_val;
        }
        break;
      case 0x4767:
        _last_val = 0;
        if (rmt_idx != -1) {
          pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
        }
        if (lo < lop) {
          lo = lop;
        }
        pdVar12 = (double *)((long)pvVar5 + lo * 0x10 + lop * -0x10 + 8);
        for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
          if (((pdVar12[-1] != 0.0) || (NAN(pdVar12[-1]))) || ((*pdVar12 != 0.0 || (NAN(*pdVar12))))
             ) {
            _last_val = *(long *)((long)pvVar6 + lVar15 * 8);
          }
          *(long *)((long)pvVar11 + lVar15 * 8) = _last_val;
          pdVar12 = pdVar12 + 2;
        }
        break;
      case 0x4770:
        _last_val = 0;
        if (rmt_idx != -1) {
          pnga_get(local_a0,&rmt_idx,&rmt_idx,&last_val,&ld);
        }
        for (; lVar15 <= local_98; lVar15 = lVar15 + 1) {
          if (*(long *)((long)pvVar5 + lVar15 * 8) != 0) {
            _last_val = *(long *)((long)pvVar6 + lVar15 * 8);
          }
          *(long *)((long)pvVar11 + lVar15 * 8) = _last_val;
        }
      }
    }
  }
  IVar9 = local_90;
  pvVar11 = local_a8;
  pnga_release(local_a0,&lop,&hip);
  pnga_release(local_60,&lop,&hip);
  pnga_release_update(IVar9,&lop,&hip);
LAB_0012f2b6:
  pnga_sync();
  pnga_free(pvVar11);
  return;
}

Assistant:

void pnga_scan_copy(Integer g_src, Integer g_dst, Integer g_msk,
                           Integer lo, Integer hi)
{       
    long *lim=NULL;
    Integer i, nproc, me, elems, ioff, lop, hip, ndim, dims, ld;
    Integer type_src, type_dst, type_msk, combined_type;
    void *ptr_src=NULL;
    void *ptr_dst=NULL;
    void *ptr_msk=NULL;

    nproc = pnga_nnodes();
    me = pnga_nodeid();

    pnga_check_handle(g_src, "ga_scan_copy 1");
    pnga_check_handle(g_dst, "ga_scan_copy 2");
    pnga_check_handle(g_msk, "ga_scan_copy 3");

    if(!pnga_compare_distr(g_src, g_msk))
        pnga_error("ga_scan_copy: different distribution src",0);
    if(!pnga_compare_distr(g_dst, g_msk))
        pnga_error("ga_scan_copy: different distribution dst",0);

    pnga_inquire(g_src, &type_src, &ndim, &dims);
    pnga_inquire(g_dst, &type_dst, &ndim, &dims);
    pnga_inquire(g_msk, &type_msk, &ndim, &dims);
    if(ndim>1)pnga_error("ga_scan_copy: applicable to 1-dim arrays",ndim);
    if(g_src == g_dst) {
        pnga_error("ga_scan_copy: src and dst must be different arrays", 0);
    }
    if(type_src != type_dst) {
        pnga_error("ga_scan_copy: src and dst arrays must be same type", 0);
    }

    pnga_sync();

    pnga_distribution(g_msk, me, &lop, &hip);

    /* create arrays to hold last bit set on a given process */
    lim = (long *) pnga_malloc(nproc, MT_C_LONGINT, "ga scan buf");
    bzero(lim,sizeof(long)*nproc);
    lim[me] = -1;

    /* find last bit set on given process (store as global index) */
    if ( lop > 0 ){ /* we get 0 if no elements stored on this process */ 
        elems = hip - lop + 1;
        pnga_access_ptr(g_msk, &lop, &hip, &ptr_msk, &ld);
        switch (type_msk) {
#define TYPE_CASE(MT,T,AT)                                      \
            case MT:                                            \
                {                                               \
                    T * restrict buf = (T*)ptr_msk;             \
                    for(i=0; i<elems; i++) {                    \
                        if (neq_zero_##AT(buf[i])) {            \
                            ioff = i + lop;                     \
                            if (ioff >= lo && ioff <= hi) {     \
                                lim[me]= ioff;                  \
                            }                                   \
                        }                                       \
                    }                                           \
                    break;                                      \
                }
#include "types.xh"
#undef TYPE_CASE
        }
        pnga_release(g_msk, &lop, &hip);
    }
    pnga_gop(C_LONG,lim,nproc,"+");

    if(hi <lop || hip <lo) {
        /* we have no elements to update */
    }
    else {
        Integer rmt_idx, start, stop;

        if (lop < lo) {
            start = lo - lop;
        } else {
            start = 0;
        }
        if (hip > hi) {
            stop = hi-lop+1;
        } else {
            stop = hip-lop+1;
        }

        /* If start bit is not first local bit, find last remote bit.
         * We must scan the entire lim to find the next-highest index.
         * Otherwise, this algorithm won't work with restricted arrays? */
        rmt_idx = -1;
        for (i=0; i<nproc; i++) {
            if (-1 != lim[i] && lim[i] > rmt_idx && lim[i] < lop) {
                rmt_idx = lim[i];
            }
        }

        pnga_access_ptr(g_src, &lop, &hip, &ptr_src, &ld);
        pnga_access_ptr(g_dst, &lop, &hip, &ptr_dst, &ld);
        pnga_access_ptr(g_msk, &lop, &hip, &ptr_msk, &ld);
        combined_type = MT_NUMTYPES*type_src + type_msk;
        switch (combined_type) {
#define TYPE_CASE(MT,T,AT,MT_MSK,T_MSK,AT_MSK)                              \
            case (MT_NUMTYPES*MT) + MT_MSK:                                 \
                {                                                           \
                    T * restrict src = (T*)ptr_src;                         \
                    T * restrict dst = (T*)ptr_dst;                         \
                    T_MSK * restrict msk = (T_MSK*)ptr_msk;                 \
                    T last_val;                                             \
                    assign_zero_##AT(last_val);                             \
                    if (-1 != rmt_idx) {                                    \
                        pnga_get(g_src, &rmt_idx, &rmt_idx, &last_val, &ld);\
                    }                                                       \
                    for (i=start; i<stop; i++) {                            \
                        if (neq_zero_##AT_MSK(msk[i])) {                    \
                            assign_##AT(last_val, src[i]);                  \
                        }                                                   \
                        assign_##AT(dst[i], last_val);                      \
                    }                                                       \
                    break;                                                  \
                }
#include "types2.xh"
#undef TYPE_CASE
            default: pnga_error("ga_scan_copy:wrong data type",combined_type);
        }
        /* release local access to arrays */
        pnga_release(g_src, &lop, &hip);
        pnga_release(g_msk, &lop, &hip);
        pnga_release_update(g_dst, &lop, &hip);
    }

    pnga_sync();
    pnga_free(lim);
}